

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_2.cpp
# Opt level: O0

bool is_valid(Date *d)

{
  bool bVar1;
  bool local_15;
  bool local_14;
  bool local_13;
  bool is_valid;
  Date *d_local;
  
  bVar1 = false;
  if (((0 < d->y) && (bVar1 = false, 0 < d->m)) && (bVar1 = false, d->m < 0xd)) {
    bVar1 = 0 < d->d;
  }
  local_13 = false;
  if (bVar1) {
    bVar1 = is_31_day_month(d->m);
    if (((!bVar1) || (local_14 = true, 0x1f < d->d)) &&
       ((bVar1 = is_30_day_month(d->m), !bVar1 || (local_14 = true, 0x1e < d->d)))) {
      if (((d->m != 2) || (bVar1 = is_leap(d), !bVar1)) || (local_15 = true, 0x1d < d->d)) {
        local_15 = d->d < 0x1d;
      }
      local_14 = local_15;
    }
    local_13 = local_14;
  }
  return local_13;
}

Assistant:

bool is_valid(const Date& d)
{
	bool is_valid = d.y > 0 && (d.m > 0 && d.m < 13) && d.d > 0;
	is_valid = is_valid && (
		(is_31_day_month(d.m) && d.d < 32) ||
		(is_30_day_month(d.m) && d.d < 31) ||
		(d.m == 2 && (is_leap(d) && d.d < 30) || d.d < 29)
		);
	return is_valid;
}